

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O2

int flvtag_addsei(flvtag_t *tag,sei_t *sei)

{
  uint *puVar1;
  uint8_t *puVar2;
  byte bVar3;
  flvtag_avcpackettype_t fVar4;
  uint32_t uVar5;
  uint32_t cts;
  flvtag_frametype_t type;
  uint *puVar6;
  size_t sVar7;
  int iVar8;
  uint uVar9;
  flvtag_t new_tag;
  sei_t new_sei;
  flvtag_t tag3;
  
  fVar4 = flvtag_avcpackettype(tag);
  iVar8 = 0;
  if (fVar4 == flvtag_avcpackettype_nalu) {
    uVar5 = flvtag_pts(tag);
    sei_init(&new_sei,(double)uVar5);
    sei_cat(&new_sei,sei,1);
    uVar5 = flvtag_dts(tag);
    cts = flvtag_cts(tag);
    type = flvtag_frametype(tag);
    flvtag_initavc(&new_tag,uVar5,cts,type);
    puVar6 = (uint *)flvtag_payload_data(tag);
    sVar7 = flvtag_payload_size(tag);
    while (0 < (long)sVar7) {
      bVar3 = (byte)puVar6[1] & 0x1f;
      uVar9 = *puVar6;
      uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      puVar1 = (uint *)((ulong)(uVar9 + 4) + (long)puVar6);
      sVar7 = sVar7 - (uVar9 + 4);
      if (bVar3 == 6) {
        sei_cat(&new_sei,sei,0);
        puVar6 = puVar1;
      }
      else if (((byte)(bVar3 - 10) < 0xfd) && (new_sei.head != (sei_message_t *)0x0)) {
        flvtag_avcwritesei(&new_tag,&new_sei);
        flvtag_avcwritenal(&new_tag,(uint8_t *)(puVar6 + 1),(ulong)uVar9);
        sei_free(&new_sei);
        puVar6 = puVar1;
      }
      else {
        flvtag_avcwritenal(&new_tag,(uint8_t *)(puVar6 + 1),(ulong)uVar9);
        puVar6 = puVar1;
      }
    }
    if (new_sei.head != (sei_message_t *)0x0) {
      flvtag_avcwritesei(&new_tag,&new_sei);
      sei_free(&new_sei);
    }
    puVar2 = tag->data;
    sVar7 = tag->aloc;
    tag->data = new_tag.data;
    tag->aloc = new_tag.aloc;
    new_tag.data = puVar2;
    new_tag.aloc = sVar7;
    flvtag_free(&new_tag);
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int flvtag_addsei(flvtag_t* tag, sei_t* sei)
{
    if (flvtag_avcpackettype_nalu != flvtag_avcpackettype(tag)) {
        return 0;
    }

    sei_t new_sei;
    sei_init(&new_sei, flvtag_pts(tag));
    sei_cat(&new_sei, sei, 1);

    flvtag_t new_tag;
    flvtag_initavc(&new_tag, flvtag_dts(tag), flvtag_cts(tag), flvtag_frametype(tag));

    uint8_t* data = flvtag_payload_data(tag);
    ssize_t size = flvtag_payload_size(tag);

    while (0 < size) {
        uint8_t* nalu_data = &data[LENGTH_SIZE];
        uint8_t nalu_type = nalu_data[0] & 0x1F;
        uint32_t nalu_size = (data[0] << 24) | (data[1] << 16) | (data[2] << 8) | data[3];
        data += LENGTH_SIZE + nalu_size;
        size -= LENGTH_SIZE + nalu_size;

        if (6 == nalu_type) {
            sei_cat(&new_sei, sei, 0); // copy non itu_t_t35 sei messages
        } else if (new_sei.head && 7 != nalu_type && 8 != nalu_type && 9 != nalu_type) {
            flvtag_avcwritesei(&new_tag, &new_sei);
            flvtag_avcwritenal(&new_tag, nalu_data, nalu_size);
            sei_free(&new_sei);
        } else {
            flvtag_avcwritenal(&new_tag, nalu_data, nalu_size);
        }
    }

    // On the off chance we have an empty frame, we still wish to write the sei
    if (new_sei.head) {
        flvtag_avcwritesei(&new_tag, &new_sei);
        sei_free(&new_sei);
    }

    flvtag_swap(tag, &new_tag);
    flvtag_free(&new_tag);
    return 1;
}